

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_set_ssl_version_min_max(Curl_cfilter *cf,SSL_CTX *ctx)

{
  uint uVar1;
  ssl_primary_config *psVar2;
  ulong uVar3;
  long lVar4;
  long local_48;
  long ossl_ssl_version_max;
  long ossl_ssl_version_min;
  long curl_ssl_version_max;
  long curl_ssl_version_min;
  ssl_primary_config *conn_config;
  SSL_CTX *ctx_local;
  Curl_cfilter *cf_local;
  
  psVar2 = Curl_ssl_cf_get_primary_config(cf);
  uVar3 = (ulong)psVar2->version;
  ossl_ssl_version_max = 0;
  if (uVar3 - 1 < 6 || uVar3 == 7) {
    switch((long)&switchD_00ad3edc::switchdataD_01004230 +
           (long)(int)(&switchD_00ad3edc::switchdataD_01004230)[uVar3 - 1]) {
    case 0xad3ede:
      ossl_ssl_version_max = 0x301;
      break;
    case 0xad3ee8:
      ossl_ssl_version_max = 0x302;
      break;
    case 0xad3ef2:
      ossl_ssl_version_max = 0x303;
      break;
    case 0xad3efc:
      ossl_ssl_version_max = 0x304;
    }
  }
  if ((uVar3 != 0) &&
     (lVar4 = SSL_CTX_ctrl((SSL_CTX *)ctx,0x7b,ossl_ssl_version_max,(void *)0x0), lVar4 == 0)) {
    return CURLE_SSL_CONNECT_ERROR;
  }
  uVar1 = psVar2->version_max;
  if ((uVar1 != 0) && (uVar1 != 0x10000)) {
    if (uVar1 == 0x40000) {
      local_48 = 0x301;
      goto LAB_00ad3fc7;
    }
    if (uVar1 == 0x50000) {
      local_48 = 0x302;
      goto LAB_00ad3fc7;
    }
    if (uVar1 == 0x60000) {
      local_48 = 0x303;
      goto LAB_00ad3fc7;
    }
    if (uVar1 == 0x70000) {
      local_48 = 0x304;
      goto LAB_00ad3fc7;
    }
  }
  local_48 = 0;
LAB_00ad3fc7:
  lVar4 = SSL_CTX_ctrl((SSL_CTX *)ctx,0x7c,local_48,(void *)0x0);
  if (lVar4 == 0) {
    cf_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
  }
  else {
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode
ossl_set_ssl_version_min_max(struct Curl_cfilter *cf, SSL_CTX *ctx)
{
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  /* first, TLS min version... */
  long curl_ssl_version_min = conn_config->version;
  long curl_ssl_version_max;

  /* convert curl min SSL version option to OpenSSL constant */
#if (defined(OPENSSL_IS_BORINGSSL)  || \
     defined(OPENSSL_IS_AWSLC)      || \
     defined(LIBRESSL_VERSION_NUMBER))
  uint16_t ossl_ssl_version_min = 0;
  uint16_t ossl_ssl_version_max = 0;
#else
  long ossl_ssl_version_min = 0;
  long ossl_ssl_version_max = 0;
#endif
  switch(curl_ssl_version_min) {
  case CURL_SSLVERSION_TLSv1: /* TLS 1.x */
  case CURL_SSLVERSION_TLSv1_0:
    ossl_ssl_version_min = TLS1_VERSION;
    break;
  case CURL_SSLVERSION_TLSv1_1:
    ossl_ssl_version_min = TLS1_1_VERSION;
    break;
  case CURL_SSLVERSION_TLSv1_2:
    ossl_ssl_version_min = TLS1_2_VERSION;
    break;
  case CURL_SSLVERSION_TLSv1_3:
#ifdef TLS1_3_VERSION
    ossl_ssl_version_min = TLS1_3_VERSION;
    break;
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }

  /* CURL_SSLVERSION_DEFAULT means that no option was selected.
     We don't want to pass 0 to SSL_CTX_set_min_proto_version as
     it would enable all versions down to the lowest supported by
     the library.
     So we skip this, and stay with the library default
  */
  if(curl_ssl_version_min != CURL_SSLVERSION_DEFAULT) {
    if(!SSL_CTX_set_min_proto_version(ctx, ossl_ssl_version_min)) {
      return CURLE_SSL_CONNECT_ERROR;
    }
  }

  /* ... then, TLS max version */
  curl_ssl_version_max = conn_config->version_max;

  /* convert curl max SSL version option to OpenSSL constant */
  switch(curl_ssl_version_max) {
  case CURL_SSLVERSION_MAX_TLSv1_0:
    ossl_ssl_version_max = TLS1_VERSION;
    break;
  case CURL_SSLVERSION_MAX_TLSv1_1:
    ossl_ssl_version_max = TLS1_1_VERSION;
    break;
  case CURL_SSLVERSION_MAX_TLSv1_2:
    ossl_ssl_version_max = TLS1_2_VERSION;
    break;
#ifdef TLS1_3_VERSION
  case CURL_SSLVERSION_MAX_TLSv1_3:
    ossl_ssl_version_max = TLS1_3_VERSION;
    break;
#endif
  case CURL_SSLVERSION_MAX_NONE:  /* none selected */
  case CURL_SSLVERSION_MAX_DEFAULT:  /* max selected */
  default:
    /* SSL_CTX_set_max_proto_version states that:
       setting the maximum to 0 will enable
       protocol versions up to the highest version
       supported by the library */
    ossl_ssl_version_max = 0;
    break;
  }

  if(!SSL_CTX_set_max_proto_version(ctx, ossl_ssl_version_max)) {
    return CURLE_SSL_CONNECT_ERROR;
  }

  return CURLE_OK;
}